

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TimeDependencies.cpp
# Opt level: O0

DependencyInfo *
helics::getExecEntryMinFederate
          (TimeDependencies *dependencies,GlobalFederateId self,ConnectionType ignoreType,
          GlobalFederateId ignore)

{
  bool bVar1;
  int iVar2;
  reference pDVar3;
  GlobalFederateId in_ECX;
  ConnectionType in_DL;
  BaseType in_ESI;
  DependencyInfo *dep;
  const_iterator __end1;
  const_iterator __begin1;
  TimeDependencies *__range1;
  DependencyInfo *minDep;
  TimeDependencies *in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff90;
  GlobalFederateId in_stack_ffffffffffffff94;
  undefined4 in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffff9c;
  TimeState *in_stack_ffffffffffffffa0;
  DependencyInfo *in_stack_ffffffffffffffa8;
  __normal_iterator<const_helics::DependencyInfo_*,_std::vector<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>_>
  in_stack_ffffffffffffffb0;
  DependencyInfo *local_40;
  GlobalFederateId local_4;
  
  local_4.gid = in_ESI;
  if ((getExecEntryMinFederate(helics::TimeDependencies_const&,helics::GlobalFederateId,helics::ConnectionType,helics::GlobalFederateId)
       ::maxDep == '\0') &&
     (iVar2 = __cxa_guard_acquire(&getExecEntryMinFederate(helics::TimeDependencies_const&,helics::GlobalFederateId,helics::ConnectionType,helics::GlobalFederateId)
                                   ::maxDep), iVar2 != 0)) {
    TimeRepresentation<count_time<9,_long>_>::maxVal();
    DependencyInfo::DependencyInfo<helics::TimeState,unsigned_char>
              (in_stack_ffffffffffffffa8,(Time)in_stack_ffffffffffffffb0._M_current,
               in_stack_ffffffffffffffa0,
               (uchar *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
    __cxa_guard_release(&getExecEntryMinFederate(helics::TimeDependencies_const&,helics::GlobalFederateId,helics::ConnectionType,helics::GlobalFederateId)
                         ::maxDep);
  }
  local_40 = &getExecEntryMinFederate::maxDep;
  TimeDependencies::begin(in_stack_ffffffffffffff88);
  TimeDependencies::end(in_stack_ffffffffffffff88);
  do {
    bVar1 = __gnu_cxx::
            operator==<const_helics::DependencyInfo_*,_std::vector<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>_>
                      ((__normal_iterator<const_helics::DependencyInfo_*,_std::vector<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>_>
                        *)CONCAT44(in_stack_ffffffffffffff94.gid,in_stack_ffffffffffffff90),
                       (__normal_iterator<const_helics::DependencyInfo_*,_std::vector<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>_>
                        *)in_stack_ffffffffffffff88);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      return local_40;
    }
    pDVar3 = __gnu_cxx::
             __normal_iterator<const_helics::DependencyInfo_*,_std::vector<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>_>
             ::operator*((__normal_iterator<const_helics::DependencyInfo_*,_std::vector<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>_>
                          *)&stack0xffffffffffffffb0);
    if ((((((pDVar3->dependency & 1U) != 0) &&
          (bVar1 = GlobalFederateId::operator==(&pDVar3->fedID,in_ECX), !bVar1)) &&
         (pDVar3->connection != SELF)) &&
        ((pDVar3->connection != in_DL &&
         ((bVar1 = GlobalFederateId::isValid(&local_4), !bVar1 ||
          (bVar1 = GlobalFederateId::operator==(&(pDVar3->super_TimeData).minFedActual,local_4),
          !bVar1)))))) &&
       (((pDVar3->super_TimeData).mTimeState < exec_requested &&
        ((pDVar3->super_TimeData).restrictionLevel <= (local_40->super_TimeData).restrictionLevel)))
       ) {
      bVar1 = GlobalFederateId::isValid(&local_40->fedID);
      if (bVar1) {
        in_stack_ffffffffffffff94.gid = (local_40->fedID).gid;
        bVar1 = GlobalFederateId::operator<(&pDVar3->fedID,in_stack_ffffffffffffff94);
        if (!bVar1) goto LAB_00564e36;
      }
      local_40 = pDVar3;
      if ((pDVar3->super_TimeData).mTimeState == initialized) {
        local_40 = &getExecEntryMinFederate::maxDep;
        return local_40;
      }
    }
LAB_00564e36:
    __gnu_cxx::
    __normal_iterator<const_helics::DependencyInfo_*,_std::vector<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>_>
    ::operator++((__normal_iterator<const_helics::DependencyInfo_*,_std::vector<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>_>
                  *)&stack0xffffffffffffffb0);
  } while( true );
}

Assistant:

const DependencyInfo& getExecEntryMinFederate(const TimeDependencies& dependencies,
                                              GlobalFederateId self,
                                              ConnectionType ignoreType,
                                              GlobalFederateId ignore)
{
    static const DependencyInfo maxDep{Time::maxVal(),
                                       TimeState::initialized,
                                       static_cast<std::uint8_t>(50U)};

    const DependencyInfo* minDep = &maxDep;

    for (const auto& dep : dependencies) {
        if (!dep.dependency) {
            continue;
        }
        if (dep.fedID == ignore) {
            continue;
        }
        if (dep.connection == ConnectionType::SELF || dep.connection == ignoreType) {
            continue;
        }
        if (self.isValid() && dep.minFedActual == self) {
            continue;
        }
        if (dep.mTimeState > TimeState::exec_requested_iterative) {
            continue;
        }
        if (dep.restrictionLevel > minDep->restrictionLevel) {
            continue;
        }
        if (!minDep->fedID.isValid() || dep.fedID < minDep->fedID) {
            minDep = &dep;
            if (minDep->mTimeState == TimeState::initialized) {
                minDep = &maxDep;
                break;
            }
        }
    }
    return *minDep;
}